

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O0

undefined8 trng::lagfib2plus<unsigned_int,168u,521u>::init_name_abi_cxx11_(void)

{
  ostream *poVar1;
  undefined8 in_RDI;
  stringstream name_str;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,"lagfib2plus_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
  poVar1 = std::operator<<(poVar1,'_');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa8);
  poVar1 = std::operator<<(poVar1,'_');
  std::ostream::operator<<(poVar1,0x209);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return in_RDI;
}

Assistant:

static std::string init_name() {
      std::stringstream name_str;
      name_str << "lagfib2plus_" << std::numeric_limits<result_type>::digits << '_' << A << '_'
               << B;
      return name_str.str();
    }